

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx512::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  byte bVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  char cVar35;
  byte bVar36;
  bool bVar37;
  AABBNodeMB4D *node1;
  undefined4 uVar38;
  uint uVar39;
  ulong uVar40;
  ulong *puVar41;
  long lVar42;
  NodeRef root;
  uint uVar43;
  undefined1 (*pauVar44) [32];
  byte bVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar52 [16];
  int iVar49;
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar51 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 in_ZMM4 [64];
  float fVar84;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar85 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  vfloat4 a0;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  byte local_2a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29e0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  int iVar50;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  
  bvh = (BVH *)This->ptr;
  sVar2 = (bvh->root).ptr;
  if (sVar2 != 8) {
    auVar58 = *(undefined1 (*) [32])(ray + 0x100);
    auVar55 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar46 = vcmpps_avx512vl(auVar58,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar40 = vpcmpeqd_avx512vl(auVar55,(undefined1  [32])valid_i->field_0);
    uVar46 = uVar46 & uVar40;
    bVar45 = (byte)uVar46;
    if (bVar45 != 0) {
      local_2980 = *(undefined1 (*) [32])(ray + 0x80);
      local_2960 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2940 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar9 = local_2940._0_4_;
      auVar109._0_4_ = fVar9 * fVar9;
      fVar10 = local_2940._4_4_;
      auVar109._4_4_ = fVar10 * fVar10;
      fVar11 = local_2940._8_4_;
      auVar109._8_4_ = fVar11 * fVar11;
      fVar12 = local_2940._12_4_;
      auVar109._12_4_ = fVar12 * fVar12;
      fVar13 = local_2940._16_4_;
      auVar109._16_4_ = fVar13 * fVar13;
      fVar14 = local_2940._20_4_;
      auVar109._20_4_ = fVar14 * fVar14;
      fVar15 = local_2940._24_4_;
      auVar109._28_36_ = in_ZMM4._28_36_;
      auVar109._24_4_ = fVar15 * fVar15;
      auVar53 = vfmadd231ps_fma(auVar109._0_32_,local_2960,local_2960);
      auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),local_2980,local_2980);
      auVar54 = vrsqrt14ps_avx512vl(ZEXT1632(auVar53));
      auVar55._8_4_ = 0xbf000000;
      auVar55._0_8_ = 0xbf000000bf000000;
      auVar55._12_4_ = 0xbf000000;
      auVar55._16_4_ = 0xbf000000;
      auVar55._20_4_ = 0xbf000000;
      auVar55._24_4_ = 0xbf000000;
      auVar55._28_4_ = 0xbf000000;
      auVar55 = vmulps_avx512vl(ZEXT1632(auVar53),auVar55);
      fVar84 = auVar54._0_4_;
      fVar88 = auVar54._4_4_;
      fVar89 = auVar54._8_4_;
      fVar90 = auVar54._12_4_;
      fVar91 = auVar54._16_4_;
      fVar92 = auVar54._20_4_;
      fVar93 = auVar54._24_4_;
      auVar53._0_4_ = fVar84 * fVar84;
      auVar53._4_4_ = fVar88 * fVar88;
      auVar53._8_4_ = fVar89 * fVar89;
      auVar53._12_4_ = fVar90 * fVar90;
      auVar57._4_4_ = auVar53._4_4_ * fVar88 * auVar55._4_4_;
      auVar57._0_4_ = auVar53._0_4_ * fVar84 * auVar55._0_4_;
      auVar57._8_4_ = auVar53._8_4_ * fVar89 * auVar55._8_4_;
      auVar57._12_4_ = auVar53._12_4_ * fVar90 * auVar55._12_4_;
      auVar57._16_4_ = fVar91 * fVar91 * fVar91 * auVar55._16_4_;
      auVar57._20_4_ = fVar92 * fVar92 * fVar92 * auVar55._20_4_;
      auVar57._24_4_ = fVar93 * fVar93 * fVar93 * auVar55._24_4_;
      auVar57._28_4_ = auVar55._28_4_;
      auVar56._8_4_ = 0x3fc00000;
      auVar56._0_8_ = 0x3fc000003fc00000;
      auVar56._12_4_ = 0x3fc00000;
      auVar56._16_4_ = 0x3fc00000;
      auVar56._20_4_ = 0x3fc00000;
      auVar56._24_4_ = 0x3fc00000;
      auVar56._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar57,auVar54,auVar56);
      auVar81._8_4_ = 0x80000000;
      auVar81._0_8_ = 0x8000000080000000;
      auVar81._12_4_ = 0x80000000;
      auVar85._12_4_ = 0;
      auVar85._0_12_ = ZEXT812(0);
      auVar85 = auVar85 << 0x20;
      auVar53 = vpcmpeqd_avx(auVar53,auVar53);
      uVar40 = uVar46;
      do {
        lVar42 = 0;
        for (uVar48 = uVar40; (uVar48 & 1) == 0; uVar48 = uVar48 >> 1 | 0x8000000000000000) {
          lVar42 = lVar42 + 1;
        }
        uVar48 = (ulong)(uint)((int)lVar42 * 4);
        auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar48 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar48 + 0xa0)),0x1c);
        fVar84 = *(float *)((long)&local_27c0 + uVar48);
        auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + uVar48 + 0xc0)),0x28);
        auVar99._0_4_ = auVar52._0_4_ * fVar84;
        auVar99._4_4_ = auVar52._4_4_ * fVar84;
        auVar99._8_4_ = auVar52._8_4_ * fVar84;
        auVar99._12_4_ = auVar52._12_4_ * fVar84;
        auVar52 = vshufpd_avx(auVar99,auVar99,1);
        auVar100 = vmovshdup_avx(auVar99);
        auVar102 = vunpckhps_avx(auVar99,auVar85);
        auVar51._0_8_ = auVar52._0_8_ ^ 0x8000000080000000;
        auVar51._8_8_ = auVar52._8_8_ ^ auVar81._8_8_;
        auVar51 = vinsertps_avx(auVar51,auVar99,0x2a);
        auVar52 = vdpps_avx(auVar51,auVar51,0x7f);
        auVar102 = vshufps_avx(auVar102,ZEXT416(auVar100._0_4_ ^ 0x80000000),0x41);
        auVar100 = vdpps_avx(auVar102,auVar102,0x7f);
        uVar16 = vcmpps_avx512vl(auVar52,auVar100,1);
        auVar52 = vpmovm2d_avx512vl(uVar16);
        auVar106._0_4_ = auVar52._0_4_;
        auVar106._4_4_ = auVar106._0_4_;
        auVar106._8_4_ = auVar106._0_4_;
        auVar106._12_4_ = auVar106._0_4_;
        uVar48 = vpmovd2m_avx512vl(auVar106);
        auVar52._4_4_ = (uint)((byte)(uVar48 >> 1) & 1) * auVar53._4_4_;
        auVar52._0_4_ = (uint)((byte)uVar48 & 1) * auVar53._0_4_;
        auVar52._8_4_ = (uint)((byte)(uVar48 >> 2) & 1) * auVar53._8_4_;
        auVar52._12_4_ = (uint)((byte)(uVar48 >> 3) & 1) * auVar53._12_4_;
        auVar52 = vblendvps_avx(auVar51,auVar102,auVar52);
        auVar100 = vdpps_avx(auVar52,auVar52,0x7f);
        auVar51 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar100._0_4_));
        fVar88 = auVar51._0_4_;
        fVar88 = fVar88 * 1.5 - auVar100._0_4_ * 0.5 * fVar88 * fVar88 * fVar88;
        auVar102._0_4_ = auVar52._0_4_ * fVar88;
        auVar102._4_4_ = auVar52._4_4_ * fVar88;
        auVar102._8_4_ = auVar52._8_4_ * fVar88;
        auVar102._12_4_ = auVar52._12_4_ * fVar88;
        auVar52 = vshufps_avx(auVar102,auVar102,0xc9);
        auVar100 = vshufps_avx(auVar99,auVar99,0xc9);
        auVar107._0_4_ = auVar102._0_4_ * auVar100._0_4_;
        auVar107._4_4_ = auVar102._4_4_ * auVar100._4_4_;
        auVar107._8_4_ = auVar102._8_4_ * auVar100._8_4_;
        auVar107._12_4_ = auVar102._12_4_ * auVar100._12_4_;
        auVar52 = vfmsub231ps_fma(auVar107,auVar99,auVar52);
        lVar42 = lVar42 * 0x30;
        auVar100 = vshufps_avx(auVar52,auVar52,0xc9);
        auVar52 = vdpps_avx(auVar100,auVar100,0x7f);
        uVar40 = uVar40 - 1 & uVar40;
        auVar51 = vrsqrt14ss_avx512f(auVar85,ZEXT416((uint)auVar52._0_4_));
        fVar88 = auVar51._0_4_;
        fVar88 = fVar88 * 1.5 - auVar52._0_4_ * 0.5 * fVar88 * fVar88 * fVar88;
        auVar104._0_4_ = fVar88 * auVar100._0_4_;
        auVar104._4_4_ = fVar88 * auVar100._4_4_;
        auVar104._8_4_ = fVar88 * auVar100._8_4_;
        auVar104._12_4_ = fVar88 * auVar100._12_4_;
        auVar100._0_4_ = fVar84 * auVar99._0_4_;
        auVar100._4_4_ = fVar84 * auVar99._4_4_;
        auVar100._8_4_ = fVar84 * auVar99._8_4_;
        auVar100._12_4_ = fVar84 * auVar99._12_4_;
        auVar51 = vunpcklps_avx(auVar102,auVar100);
        auVar52 = vunpckhps_avx(auVar102,auVar100);
        auVar102 = vunpcklps_avx(auVar104,auVar85);
        auVar100 = vunpckhps_avx(auVar104,auVar85);
        auVar100 = vunpcklps_avx(auVar52,auVar100);
        auVar99 = vunpcklps_avx(auVar51,auVar102);
        auVar52 = vunpckhps_avx(auVar51,auVar102);
        *(undefined1 (*) [16])(local_27a0 + lVar42) = auVar99;
        *(undefined1 (*) [16])(auStack_2790 + lVar42) = auVar52;
        *(undefined1 (*) [16])(auStack_2780 + lVar42) = auVar100;
      } while (uVar40 != 0);
      local_29e0._0_4_ = *(undefined4 *)ray;
      local_29e0._4_4_ = *(undefined4 *)(ray + 4);
      local_29e0._8_4_ = *(undefined4 *)(ray + 8);
      local_29e0._12_4_ = *(undefined4 *)(ray + 0xc);
      local_29e0._16_4_ = *(undefined4 *)(ray + 0x10);
      local_29e0._20_4_ = *(undefined4 *)(ray + 0x14);
      local_29e0._24_4_ = *(undefined4 *)(ray + 0x18);
      local_29e0._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_29e0._32_4_ = *(undefined4 *)(ray + 0x20);
      local_29e0._36_4_ = *(undefined4 *)(ray + 0x24);
      local_29e0._40_4_ = *(undefined4 *)(ray + 0x28);
      local_29e0._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_29e0._48_4_ = *(undefined4 *)(ray + 0x30);
      local_29e0._52_4_ = *(undefined4 *)(ray + 0x34);
      local_29e0._56_4_ = *(undefined4 *)(ray + 0x38);
      local_29e0._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_29e0._64_4_ = *(undefined4 *)(ray + 0x40);
      local_29e0._68_4_ = *(undefined4 *)(ray + 0x44);
      local_29e0._72_4_ = *(undefined4 *)(ray + 0x48);
      local_29e0._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_29e0._80_4_ = *(undefined4 *)(ray + 0x50);
      local_29e0._84_4_ = *(undefined4 *)(ray + 0x54);
      local_29e0._88_4_ = *(undefined4 *)(ray + 0x58);
      local_29e0._92_4_ = *(undefined4 *)(ray + 0x5c);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar109 = ZEXT3264(auVar55);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar110 = ZEXT3264(auVar56);
      vandps_avx512vl(local_2980,auVar55);
      uVar40 = vcmpps_avx512vl(auVar56,auVar56,1);
      bVar37 = (bool)((byte)uVar40 & 1);
      iVar49 = auVar56._0_4_;
      auVar54._0_4_ = (uint)bVar37 * iVar49 | (uint)!bVar37 * local_2980._0_4_;
      bVar37 = (bool)((byte)(uVar40 >> 1) & 1);
      iVar50 = auVar56._4_4_;
      auVar54._4_4_ = (uint)bVar37 * iVar50 | (uint)!bVar37 * local_2980._4_4_;
      bVar37 = (bool)((byte)(uVar40 >> 2) & 1);
      iVar72 = auVar56._8_4_;
      auVar54._8_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * local_2980._8_4_;
      bVar37 = (bool)((byte)(uVar40 >> 3) & 1);
      iVar73 = auVar56._12_4_;
      auVar54._12_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * local_2980._12_4_;
      bVar37 = (bool)((byte)(uVar40 >> 4) & 1);
      iVar74 = auVar56._16_4_;
      auVar54._16_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * local_2980._16_4_;
      bVar37 = (bool)((byte)(uVar40 >> 5) & 1);
      iVar75 = auVar56._20_4_;
      auVar54._20_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * local_2980._20_4_;
      bVar37 = (bool)((byte)(uVar40 >> 6) & 1);
      iVar76 = auVar56._24_4_;
      iVar77 = auVar56._28_4_;
      auVar54._24_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * local_2980._24_4_;
      bVar37 = SUB81(uVar40 >> 7,0);
      auVar54._28_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * local_2980._28_4_;
      vandps_avx512vl(local_2960,auVar55);
      uVar40 = vcmpps_avx512vl(auVar54,auVar56,1);
      bVar37 = (bool)((byte)uVar40 & 1);
      auVar59._0_4_ = (uint)bVar37 * iVar49 | (uint)!bVar37 * local_2960._0_4_;
      bVar37 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar59._4_4_ = (uint)bVar37 * iVar50 | (uint)!bVar37 * local_2960._4_4_;
      bVar37 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar59._8_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * local_2960._8_4_;
      bVar37 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar59._12_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * local_2960._12_4_;
      bVar37 = (bool)((byte)(uVar40 >> 4) & 1);
      auVar59._16_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * local_2960._16_4_;
      bVar37 = (bool)((byte)(uVar40 >> 5) & 1);
      auVar59._20_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * local_2960._20_4_;
      bVar37 = (bool)((byte)(uVar40 >> 6) & 1);
      auVar59._24_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * local_2960._24_4_;
      bVar37 = SUB81(uVar40 >> 7,0);
      auVar59._28_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * local_2960._28_4_;
      vandps_avx512vl(local_2940,auVar55);
      uVar40 = vcmpps_avx512vl(auVar59,auVar56,1);
      bVar37 = (bool)((byte)uVar40 & 1);
      auVar60._0_4_ = (uint)bVar37 * iVar49 | (uint)!bVar37 * (int)fVar9;
      bVar37 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar37 * iVar50 | (uint)!bVar37 * (int)fVar10;
      bVar37 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * (int)fVar11;
      bVar37 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * (int)fVar12;
      bVar37 = (bool)((byte)(uVar40 >> 4) & 1);
      auVar60._16_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * (int)fVar13;
      bVar37 = (bool)((byte)(uVar40 >> 5) & 1);
      auVar60._20_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * (int)fVar14;
      bVar37 = (bool)((byte)(uVar40 >> 6) & 1);
      auVar60._24_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * (int)fVar15;
      bVar37 = SUB81(uVar40 >> 7,0);
      auVar60._28_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * local_2940._28_4_;
      auVar55 = vrcp14ps_avx512vl(auVar54);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar111 = ZEXT3264(auVar56);
      auVar52 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar112 = ZEXT1664(auVar52);
      auVar57 = vfnmadd213ps_avx512vl(auVar54,auVar55,auVar56);
      auVar53 = vfmadd132ps_fma(auVar57,auVar55,auVar55);
      auVar55 = vrcp14ps_avx512vl(auVar59);
      auVar57 = vfnmadd213ps_avx512vl(auVar59,auVar55,auVar56);
      auVar85 = vfmadd132ps_fma(auVar57,auVar55,auVar55);
      auVar55 = vrcp14ps_avx512vl(auVar60);
      auVar56 = vfnmadd213ps_avx512vl(auVar60,auVar55,auVar56);
      local_2920 = ZEXT1632(auVar53);
      local_2900 = ZEXT1632(auVar85);
      auVar81 = vfmadd132ps_fma(auVar56,auVar55,auVar55);
      local_28e0 = ZEXT1632(auVar81);
      local_28c0._4_4_ = (float)local_29e0._4_4_ * auVar53._4_4_;
      local_28c0._0_4_ = (float)local_29e0._0_4_ * auVar53._0_4_;
      local_28c0._8_4_ = (float)local_29e0._8_4_ * auVar53._8_4_;
      local_28c0._12_4_ = (float)local_29e0._12_4_ * auVar53._12_4_;
      local_28c0._16_4_ = (float)local_29e0._16_4_ * 0.0;
      local_28c0._20_4_ = (float)local_29e0._20_4_ * 0.0;
      local_28c0._24_4_ = (float)local_29e0._24_4_ * 0.0;
      local_28c0._28_4_ = local_29e0._28_4_;
      local_28a0._4_4_ = (float)local_29e0._36_4_ * auVar85._4_4_;
      local_28a0._0_4_ = (float)local_29e0._32_4_ * auVar85._0_4_;
      local_28a0._8_4_ = (float)local_29e0._40_4_ * auVar85._8_4_;
      local_28a0._12_4_ = (float)local_29e0._44_4_ * auVar85._12_4_;
      local_28a0._16_4_ = (float)local_29e0._48_4_ * 0.0;
      local_28a0._20_4_ = (float)local_29e0._52_4_ * 0.0;
      local_28a0._24_4_ = (float)local_29e0._56_4_ * 0.0;
      local_28a0._28_4_ = local_29e0._60_4_;
      local_2880._4_4_ = (float)local_29e0._68_4_ * auVar81._4_4_;
      local_2880._0_4_ = (float)local_29e0._64_4_ * auVar81._0_4_;
      local_2880._8_4_ = (float)local_29e0._72_4_ * auVar81._8_4_;
      local_2880._12_4_ = (float)local_29e0._76_4_ * auVar81._12_4_;
      local_2880._16_4_ = (float)local_29e0._80_4_ * 0.0;
      local_2880._20_4_ = (float)local_29e0._84_4_ * 0.0;
      local_2880._24_4_ = (float)local_29e0._88_4_ * 0.0;
      local_2880._28_4_ = local_29e0._92_4_;
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar53),ZEXT1632(auVar52),1);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar55._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar40 & 1) * auVar55._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar55._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar55._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * auVar55._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * auVar55._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * auVar55._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar40 >> 7) * auVar55._28_4_;
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar52),5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar37 = (bool)((byte)uVar40 & 1);
      local_2840 = (uint)bVar37 * auVar55._0_4_ | (uint)!bVar37 * 0x30;
      bVar37 = (bool)((byte)(uVar40 >> 1) & 1);
      uStack_283c = (uint)bVar37 * auVar55._4_4_ | (uint)!bVar37 * 0x30;
      bVar37 = (bool)((byte)(uVar40 >> 2) & 1);
      uStack_2838 = (uint)bVar37 * auVar55._8_4_ | (uint)!bVar37 * 0x30;
      bVar37 = (bool)((byte)(uVar40 >> 3) & 1);
      uStack_2834 = (uint)bVar37 * auVar55._12_4_ | (uint)!bVar37 * 0x30;
      bVar37 = (bool)((byte)(uVar40 >> 4) & 1);
      uStack_2830 = (uint)bVar37 * auVar55._16_4_ | (uint)!bVar37 * 0x30;
      bVar37 = (bool)((byte)(uVar40 >> 5) & 1);
      uStack_282c = (uint)bVar37 * auVar55._20_4_ | (uint)!bVar37 * 0x30;
      bVar37 = (bool)((byte)(uVar40 >> 6) & 1);
      uStack_2828 = (uint)bVar37 * auVar55._24_4_ | (uint)!bVar37 * 0x30;
      bVar37 = SUB81(uVar40 >> 7,0);
      uStack_2824 = (uint)bVar37 * auVar55._28_4_ | (uint)!bVar37 * 0x30;
      auVar56 = ZEXT1632(auVar52);
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar81),auVar56,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar37 = (bool)((byte)uVar40 & 1);
      local_2820 = (uint)bVar37 * auVar55._0_4_ | (uint)!bVar37 * 0x50;
      bVar37 = (bool)((byte)(uVar40 >> 1) & 1);
      uStack_281c = (uint)bVar37 * auVar55._4_4_ | (uint)!bVar37 * 0x50;
      bVar37 = (bool)((byte)(uVar40 >> 2) & 1);
      uStack_2818 = (uint)bVar37 * auVar55._8_4_ | (uint)!bVar37 * 0x50;
      bVar37 = (bool)((byte)(uVar40 >> 3) & 1);
      uStack_2814 = (uint)bVar37 * auVar55._12_4_ | (uint)!bVar37 * 0x50;
      bVar37 = (bool)((byte)(uVar40 >> 4) & 1);
      uStack_2810 = (uint)bVar37 * auVar55._16_4_ | (uint)!bVar37 * 0x50;
      bVar37 = (bool)((byte)(uVar40 >> 5) & 1);
      uStack_280c = (uint)bVar37 * auVar55._20_4_ | (uint)!bVar37 * 0x50;
      bVar37 = (bool)((byte)(uVar40 >> 6) & 1);
      uStack_2808 = (uint)bVar37 * auVar55._24_4_ | (uint)!bVar37 * 0x50;
      bVar37 = SUB81(uVar40 >> 7,0);
      uStack_2804 = (uint)bVar37 * auVar55._28_4_ | (uint)!bVar37 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = ZEXT3264(local_1e80);
      auVar55 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar56);
      local_2800 = (uint)(bVar45 & 1) * auVar55._0_4_ | (uint)!(bool)(bVar45 & 1) * local_1e80._0_4_
      ;
      bVar37 = (bool)((byte)(uVar46 >> 1) & 1);
      uStack_27fc = (uint)bVar37 * auVar55._4_4_ | (uint)!bVar37 * local_1e80._4_4_;
      bVar37 = (bool)((byte)(uVar46 >> 2) & 1);
      uStack_27f8 = (uint)bVar37 * auVar55._8_4_ | (uint)!bVar37 * local_1e80._8_4_;
      bVar37 = (bool)((byte)(uVar46 >> 3) & 1);
      uStack_27f4 = (uint)bVar37 * auVar55._12_4_ | (uint)!bVar37 * local_1e80._12_4_;
      bVar37 = (bool)((byte)(uVar46 >> 4) & 1);
      uStack_27f0 = (uint)bVar37 * auVar55._16_4_ | (uint)!bVar37 * local_1e80._16_4_;
      bVar37 = (bool)((byte)(uVar46 >> 5) & 1);
      uStack_27ec = (uint)bVar37 * auVar55._20_4_ | (uint)!bVar37 * local_1e80._20_4_;
      bVar37 = (bool)((byte)(uVar46 >> 6) & 1);
      uStack_27e8 = (uint)bVar37 * auVar55._24_4_ | (uint)!bVar37 * local_1e80._24_4_;
      bVar37 = SUB81(uVar46 >> 7,0);
      uStack_27e4 = (uint)bVar37 * auVar55._28_4_ | (uint)!bVar37 * local_1e80._28_4_;
      auVar58 = vmaxps_avx512vl(auVar58,auVar56);
      local_27e0._0_4_ = (uint)(bVar45 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar45 & 1) * -0x800000;
      bVar37 = (bool)((byte)(uVar46 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar37 * auVar58._4_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = (bool)((byte)(uVar46 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar37 * auVar58._8_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = (bool)((byte)(uVar46 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar37 * auVar58._12_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = (bool)((byte)(uVar46 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar37 * auVar58._16_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = (bool)((byte)(uVar46 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar37 * auVar58._20_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = (bool)((byte)(uVar46 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar37 * auVar58._24_4_ | (uint)!bVar37 * -0x800000;
      bVar37 = SUB81(uVar46 >> 7,0);
      local_27e0._28_4_ = (uint)bVar37 * auVar58._28_4_ | (uint)!bVar37 * -0x800000;
      local_2a44 = ~bVar45;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar43 = 5;
      }
      else {
        uVar43 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar41 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar44 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar2;
      local_1e60 = local_2800;
      uStack_1e5c = uStack_27fc;
      uStack_1e58 = uStack_27f8;
      uStack_1e54 = uStack_27f4;
      uStack_1e50 = uStack_27f0;
      uStack_1e4c = uStack_27ec;
      uStack_1e48 = uStack_27e8;
      uStack_1e44 = uStack_27e4;
LAB_0070d733:
      do {
        do {
          root.ptr = puVar41[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0070de06;
          puVar41 = puVar41 + -1;
          auVar58 = pauVar44[-1];
          auVar114 = ZEXT3264(auVar58);
          pauVar44 = pauVar44 + -1;
          uVar46 = vcmpps_avx512vl(auVar58,local_27e0,1);
        } while ((char)uVar46 == '\0');
        uVar38 = (undefined4)uVar46;
        if (uVar43 < (uint)POPCOUNT(uVar38)) {
LAB_0070d771:
          do {
            iVar49 = 4;
            lVar42 = -0x10;
            uVar46 = 8;
            auVar53 = auVar112._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0070de06;
              uVar16 = vcmpps_avx512vl(auVar114._0_32_,local_27e0,9);
              if ((char)uVar16 != '\0') {
                if (local_2a44 == 0xff) {
                  bVar36 = 0;
                }
                else {
                  uVar46 = (ulong)(byte)~local_2a44;
                  bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar3 = This->leafIntersector;
                  bVar36 = 0;
                  do {
                    lVar42 = 0;
                    for (uVar40 = uVar46; (uVar40 & 1) == 0;
                        uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                      lVar42 = lVar42 + 1;
                    }
                    cVar35 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x28))
                                       (&local_27c0,ray,lVar42,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    auVar53 = auVar112._0_16_;
                    bVar30 = (byte)(1 << ((uint)lVar42 & 0x1f));
                    if (cVar35 == '\0') {
                      bVar30 = 0;
                    }
                    bVar36 = bVar36 | bVar30;
                    uVar46 = uVar46 - 1 & uVar46;
                  } while (uVar46 != 0);
                }
                local_2a44 = local_2a44 | bVar36;
                if (local_2a44 == 0xff) {
                  local_2a44 = 0xff;
                  goto LAB_0070de06;
                }
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar37 = (bool)(local_2a44 >> 1 & 1);
                bVar4 = (bool)(local_2a44 >> 2 & 1);
                bVar5 = (bool)(local_2a44 >> 3 & 1);
                bVar6 = (bool)(local_2a44 >> 4 & 1);
                bVar7 = (bool)(local_2a44 >> 5 & 1);
                bVar8 = (bool)(local_2a44 >> 6 & 1);
                local_27e0._4_4_ = (uint)bVar37 * auVar58._4_4_ | (uint)!bVar37 * local_27e0._4_4_;
                local_27e0._0_4_ =
                     (uint)(local_2a44 & 1) * auVar58._0_4_ |
                     (uint)!(bool)(local_2a44 & 1) * local_27e0._0_4_;
                local_27e0._8_4_ = (uint)bVar4 * auVar58._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
                local_27e0._12_4_ = (uint)bVar5 * auVar58._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
                local_27e0._16_4_ = (uint)bVar6 * auVar58._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
                local_27e0._20_4_ = (uint)bVar7 * auVar58._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
                local_27e0._24_4_ = (uint)bVar8 * auVar58._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(local_2a44 >> 7) * auVar58._28_4_ |
                     (uint)!(bool)(local_2a44 >> 7) * local_27e0._28_4_;
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar109 = ZEXT3264(auVar58);
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar110 = ZEXT3264(auVar58);
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar111 = ZEXT3264(auVar58);
                auVar53 = vxorps_avx512vl(auVar53,auVar53);
                auVar112 = ZEXT1664(auVar53);
                auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar113 = ZEXT3264(auVar58);
              }
              goto LAB_0070d733;
            }
            uVar40 = root.ptr & 0xfffffffffffffff0;
            uVar39 = (uint)root.ptr & 7;
            auVar58 = auVar113._0_32_;
            do {
              uVar48 = *(ulong *)(uVar40 + 0x20 + lVar42 * 2);
              if (uVar48 == 8) break;
              if ((uVar39 == 6) || (uVar39 == 1)) {
                uVar38 = *(undefined4 *)(uVar40 + 0x90 + lVar42);
                auVar82._4_4_ = uVar38;
                auVar82._0_4_ = uVar38;
                auVar82._8_4_ = uVar38;
                auVar82._12_4_ = uVar38;
                auVar82._16_4_ = uVar38;
                auVar82._20_4_ = uVar38;
                auVar82._24_4_ = uVar38;
                auVar82._28_4_ = uVar38;
                auVar55 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar38 = *(undefined4 *)(uVar40 + 0x30 + lVar42);
                auVar61._4_4_ = uVar38;
                auVar61._0_4_ = uVar38;
                auVar61._8_4_ = uVar38;
                auVar61._12_4_ = uVar38;
                auVar61._16_4_ = uVar38;
                auVar61._20_4_ = uVar38;
                auVar61._24_4_ = uVar38;
                auVar61._28_4_ = uVar38;
                auVar56 = vfmadd213ps_avx512vl(auVar82,auVar55,auVar61);
                uVar38 = *(undefined4 *)(uVar40 + 0xb0 + lVar42);
                auVar86._4_4_ = uVar38;
                auVar86._0_4_ = uVar38;
                auVar86._8_4_ = uVar38;
                auVar86._12_4_ = uVar38;
                auVar86._16_4_ = uVar38;
                auVar86._20_4_ = uVar38;
                auVar86._24_4_ = uVar38;
                auVar86._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x50 + lVar42);
                auVar62._4_4_ = uVar38;
                auVar62._0_4_ = uVar38;
                auVar62._8_4_ = uVar38;
                auVar62._12_4_ = uVar38;
                auVar62._16_4_ = uVar38;
                auVar62._20_4_ = uVar38;
                auVar62._24_4_ = uVar38;
                auVar62._28_4_ = uVar38;
                auVar57 = vfmadd213ps_avx512vl(auVar86,auVar55,auVar62);
                uVar38 = *(undefined4 *)(uVar40 + 0xd0 + lVar42);
                auVar94._4_4_ = uVar38;
                auVar94._0_4_ = uVar38;
                auVar94._8_4_ = uVar38;
                auVar94._12_4_ = uVar38;
                auVar94._16_4_ = uVar38;
                auVar94._20_4_ = uVar38;
                auVar94._24_4_ = uVar38;
                auVar94._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x70 + lVar42);
                auVar63._4_4_ = uVar38;
                auVar63._0_4_ = uVar38;
                auVar63._8_4_ = uVar38;
                auVar63._12_4_ = uVar38;
                auVar63._16_4_ = uVar38;
                auVar63._20_4_ = uVar38;
                auVar63._24_4_ = uVar38;
                auVar63._28_4_ = uVar38;
                auVar54 = vfmadd213ps_avx512vl(auVar94,auVar55,auVar63);
                uVar38 = *(undefined4 *)(uVar40 + 0xa0 + lVar42);
                auVar96._4_4_ = uVar38;
                auVar96._0_4_ = uVar38;
                auVar96._8_4_ = uVar38;
                auVar96._12_4_ = uVar38;
                auVar96._16_4_ = uVar38;
                auVar96._20_4_ = uVar38;
                auVar96._24_4_ = uVar38;
                auVar96._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x40 + lVar42);
                auVar67._4_4_ = uVar38;
                auVar67._0_4_ = uVar38;
                auVar67._8_4_ = uVar38;
                auVar67._12_4_ = uVar38;
                auVar67._16_4_ = uVar38;
                auVar67._20_4_ = uVar38;
                auVar67._24_4_ = uVar38;
                auVar67._28_4_ = uVar38;
                auVar59 = vfmadd213ps_avx512vl(auVar96,auVar55,auVar67);
                uVar38 = *(undefined4 *)(uVar40 + 0xc0 + lVar42);
                auVar98._4_4_ = uVar38;
                auVar98._0_4_ = uVar38;
                auVar98._8_4_ = uVar38;
                auVar98._12_4_ = uVar38;
                auVar98._16_4_ = uVar38;
                auVar98._20_4_ = uVar38;
                auVar98._24_4_ = uVar38;
                auVar98._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x60 + lVar42);
                auVar68._4_4_ = uVar38;
                auVar68._0_4_ = uVar38;
                auVar68._8_4_ = uVar38;
                auVar68._12_4_ = uVar38;
                auVar68._16_4_ = uVar38;
                auVar68._20_4_ = uVar38;
                auVar68._24_4_ = uVar38;
                auVar68._28_4_ = uVar38;
                auVar60 = vfmadd213ps_avx512vl(auVar98,auVar55,auVar68);
                uVar38 = *(undefined4 *)(uVar40 + 0xe0 + lVar42);
                auVar101._4_4_ = uVar38;
                auVar101._0_4_ = uVar38;
                auVar101._8_4_ = uVar38;
                auVar101._12_4_ = uVar38;
                auVar101._16_4_ = uVar38;
                auVar101._20_4_ = uVar38;
                auVar101._24_4_ = uVar38;
                auVar101._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x80 + lVar42);
                auVar69._4_4_ = uVar38;
                auVar69._0_4_ = uVar38;
                auVar69._8_4_ = uVar38;
                auVar69._12_4_ = uVar38;
                auVar69._16_4_ = uVar38;
                auVar69._20_4_ = uVar38;
                auVar69._24_4_ = uVar38;
                auVar69._28_4_ = uVar38;
                auVar61 = vfmadd213ps_avx512vl(auVar101,auVar55,auVar69);
                auVar53 = vfmsub213ps_fma(auVar56,local_2920,local_28c0);
                auVar85 = vfmsub213ps_fma(auVar57,local_2900,local_28a0);
                auVar81 = vfmsub213ps_fma(auVar54,local_28e0,local_2880);
                auVar52 = vfmsub213ps_fma(auVar59,local_2920,local_28c0);
                auVar100 = vfmsub213ps_fma(auVar60,local_2900,local_28a0);
                auVar51 = vfmsub213ps_fma(auVar61,local_28e0,local_2880);
                auVar56 = vpminsd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar52));
                auVar57 = vpminsd_avx2(ZEXT1632(auVar85),ZEXT1632(auVar100));
                auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                auVar57 = vpminsd_avx2(ZEXT1632(auVar81),ZEXT1632(auVar51));
                auVar56 = vpmaxsd_avx2(auVar56,auVar57);
                auVar57 = vpmaxsd_avx2(ZEXT1632(auVar53),ZEXT1632(auVar52));
                auVar54 = vpmaxsd_avx2(ZEXT1632(auVar85),ZEXT1632(auVar100));
                auVar54 = vpminsd_avx2(auVar57,auVar54);
                auVar57 = vpmaxsd_avx2(ZEXT1632(auVar81),ZEXT1632(auVar51));
                auVar54 = vpminsd_avx2(auVar54,auVar57);
                auVar70._4_4_ = uStack_27fc;
                auVar70._0_4_ = local_2800;
                auVar70._8_4_ = uStack_27f8;
                auVar70._12_4_ = uStack_27f4;
                auVar70._16_4_ = uStack_27f0;
                auVar70._20_4_ = uStack_27ec;
                auVar70._24_4_ = uStack_27e8;
                auVar70._28_4_ = uStack_27e4;
                auVar57 = vpmaxsd_avx2(auVar56,auVar70);
                auVar54 = vpminsd_avx2(auVar54,local_27e0);
                uVar47 = vcmpps_avx512vl(auVar57,auVar54,2);
                if (uVar39 == 6) {
                  uVar38 = *(undefined4 *)(uVar40 + 0xf0 + lVar42);
                  auVar19._4_4_ = uVar38;
                  auVar19._0_4_ = uVar38;
                  auVar19._8_4_ = uVar38;
                  auVar19._12_4_ = uVar38;
                  auVar19._16_4_ = uVar38;
                  auVar19._20_4_ = uVar38;
                  auVar19._24_4_ = uVar38;
                  auVar19._28_4_ = uVar38;
                  uVar17 = vcmpps_avx512vl(auVar55,auVar19,0xd);
                  uVar38 = *(undefined4 *)(uVar40 + 0x100 + lVar42);
                  auVar20._4_4_ = uVar38;
                  auVar20._0_4_ = uVar38;
                  auVar20._8_4_ = uVar38;
                  auVar20._12_4_ = uVar38;
                  auVar20._16_4_ = uVar38;
                  auVar20._20_4_ = uVar38;
                  auVar20._24_4_ = uVar38;
                  auVar20._28_4_ = uVar38;
                  uVar18 = vcmpps_avx512vl(auVar55,auVar20,1);
                  uVar47 = uVar47 & uVar17 & uVar18;
                }
              }
              else {
                uVar38 = *(undefined4 *)(uVar40 + 0x30 + lVar42);
                auVar97._4_4_ = uVar38;
                auVar97._0_4_ = uVar38;
                auVar97._8_4_ = uVar38;
                auVar97._12_4_ = uVar38;
                auVar97._16_4_ = uVar38;
                auVar97._20_4_ = uVar38;
                auVar97._24_4_ = uVar38;
                auVar97._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x40 + lVar42);
                auVar95._4_4_ = uVar38;
                auVar95._0_4_ = uVar38;
                auVar95._8_4_ = uVar38;
                auVar95._12_4_ = uVar38;
                auVar95._16_4_ = uVar38;
                auVar95._20_4_ = uVar38;
                auVar95._24_4_ = uVar38;
                auVar95._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x50 + lVar42);
                auVar87._4_4_ = uVar38;
                auVar87._0_4_ = uVar38;
                auVar87._8_4_ = uVar38;
                auVar87._12_4_ = uVar38;
                auVar87._16_4_ = uVar38;
                auVar87._20_4_ = uVar38;
                auVar87._24_4_ = uVar38;
                auVar87._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x60 + lVar42);
                auVar108._4_4_ = uVar38;
                auVar108._0_4_ = uVar38;
                auVar108._8_4_ = uVar38;
                auVar108._12_4_ = uVar38;
                auVar108._16_4_ = uVar38;
                auVar108._20_4_ = uVar38;
                auVar108._24_4_ = uVar38;
                auVar108._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x70 + lVar42);
                auVar105._4_4_ = uVar38;
                auVar105._0_4_ = uVar38;
                auVar105._8_4_ = uVar38;
                auVar105._12_4_ = uVar38;
                auVar105._16_4_ = uVar38;
                auVar105._20_4_ = uVar38;
                auVar105._24_4_ = uVar38;
                auVar105._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x80 + lVar42);
                auVar103._4_4_ = uVar38;
                auVar103._0_4_ = uVar38;
                auVar103._8_4_ = uVar38;
                auVar103._12_4_ = uVar38;
                auVar103._16_4_ = uVar38;
                auVar103._20_4_ = uVar38;
                auVar103._24_4_ = uVar38;
                auVar103._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0x90 + lVar42);
                auVar83._4_4_ = uVar38;
                auVar83._0_4_ = uVar38;
                auVar83._8_4_ = uVar38;
                auVar83._12_4_ = uVar38;
                auVar83._16_4_ = uVar38;
                auVar83._20_4_ = uVar38;
                auVar83._24_4_ = uVar38;
                auVar83._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0xa0 + lVar42);
                auVar80._4_4_ = uVar38;
                auVar80._0_4_ = uVar38;
                auVar80._8_4_ = uVar38;
                auVar80._12_4_ = uVar38;
                auVar80._16_4_ = uVar38;
                auVar80._20_4_ = uVar38;
                auVar80._24_4_ = uVar38;
                auVar80._28_4_ = uVar38;
                uVar38 = *(undefined4 *)(uVar40 + 0xb0 + lVar42);
                auVar79._4_4_ = uVar38;
                auVar79._0_4_ = uVar38;
                auVar79._8_4_ = uVar38;
                auVar79._12_4_ = uVar38;
                auVar79._16_4_ = uVar38;
                auVar79._20_4_ = uVar38;
                auVar79._24_4_ = uVar38;
                auVar79._28_4_ = uVar38;
                auVar55 = *(undefined1 (*) [32])(ray + 0xe0);
                auVar69 = auVar111._0_32_;
                auVar56 = vsubps_avx512vl(auVar69,auVar55);
                uVar38 = *(undefined4 *)(uVar40 + 0xf0 + lVar42);
                auVar21._4_4_ = uVar38;
                auVar21._0_4_ = uVar38;
                auVar21._8_4_ = uVar38;
                auVar21._12_4_ = uVar38;
                auVar21._16_4_ = uVar38;
                auVar21._20_4_ = uVar38;
                auVar21._24_4_ = uVar38;
                auVar21._28_4_ = uVar38;
                auVar57 = vmulps_avx512vl(auVar55,auVar21);
                uVar38 = *(undefined4 *)(uVar40 + 0x100 + lVar42);
                auVar22._4_4_ = uVar38;
                auVar22._0_4_ = uVar38;
                auVar22._8_4_ = uVar38;
                auVar22._12_4_ = uVar38;
                auVar22._16_4_ = uVar38;
                auVar22._20_4_ = uVar38;
                auVar22._24_4_ = uVar38;
                auVar22._28_4_ = uVar38;
                auVar54 = vmulps_avx512vl(auVar55,auVar22);
                uVar38 = *(undefined4 *)(uVar40 + 0x110 + lVar42);
                auVar23._4_4_ = uVar38;
                auVar23._0_4_ = uVar38;
                auVar23._8_4_ = uVar38;
                auVar23._12_4_ = uVar38;
                auVar23._16_4_ = uVar38;
                auVar23._20_4_ = uVar38;
                auVar23._24_4_ = uVar38;
                auVar23._28_4_ = uVar38;
                auVar59 = vmulps_avx512vl(auVar55,auVar23);
                auVar62 = auVar112._0_32_;
                auVar57 = vfmadd231ps_avx512vl(auVar57,auVar56,auVar62);
                auVar54 = vfmadd231ps_avx512vl(auVar54,auVar56,auVar62);
                uVar38 = *(undefined4 *)(uVar40 + 0x120 + lVar42);
                auVar24._4_4_ = uVar38;
                auVar24._0_4_ = uVar38;
                auVar24._8_4_ = uVar38;
                auVar24._12_4_ = uVar38;
                auVar24._16_4_ = uVar38;
                auVar24._20_4_ = uVar38;
                auVar24._24_4_ = uVar38;
                auVar24._28_4_ = uVar38;
                auVar60 = vmulps_avx512vl(auVar55,auVar24);
                uVar38 = *(undefined4 *)(uVar40 + 0x130 + lVar42);
                auVar25._4_4_ = uVar38;
                auVar25._0_4_ = uVar38;
                auVar25._8_4_ = uVar38;
                auVar25._12_4_ = uVar38;
                auVar25._16_4_ = uVar38;
                auVar25._20_4_ = uVar38;
                auVar25._24_4_ = uVar38;
                auVar25._28_4_ = uVar38;
                auVar61 = vmulps_avx512vl(auVar55,auVar25);
                auVar59 = vfmadd231ps_avx512vl(auVar59,auVar56,auVar62);
                uVar38 = *(undefined4 *)(uVar40 + 0x140 + lVar42);
                auVar26._4_4_ = uVar38;
                auVar26._0_4_ = uVar38;
                auVar26._8_4_ = uVar38;
                auVar26._12_4_ = uVar38;
                auVar26._16_4_ = uVar38;
                auVar26._20_4_ = uVar38;
                auVar26._24_4_ = uVar38;
                auVar26._28_4_ = uVar38;
                auVar55 = vmulps_avx512vl(auVar55,auVar26);
                auVar60 = vaddps_avx512vl(auVar56,auVar60);
                auVar61 = vaddps_avx512vl(auVar56,auVar61);
                auVar56 = vaddps_avx512vl(auVar56,auVar55);
                auVar31._4_4_ = local_29e0._4_4_;
                auVar31._0_4_ = local_29e0._0_4_;
                auVar31._8_4_ = local_29e0._8_4_;
                auVar31._12_4_ = local_29e0._12_4_;
                auVar31._16_4_ = local_29e0._16_4_;
                auVar31._20_4_ = local_29e0._20_4_;
                auVar31._24_4_ = local_29e0._24_4_;
                auVar31._28_4_ = local_29e0._28_4_;
                auVar32._4_4_ = local_29e0._36_4_;
                auVar32._0_4_ = local_29e0._32_4_;
                auVar32._8_4_ = local_29e0._40_4_;
                auVar32._12_4_ = local_29e0._44_4_;
                auVar32._16_4_ = local_29e0._48_4_;
                auVar32._20_4_ = local_29e0._52_4_;
                auVar32._24_4_ = local_29e0._56_4_;
                auVar32._28_4_ = local_29e0._60_4_;
                auVar33._4_4_ = local_29e0._68_4_;
                auVar33._0_4_ = local_29e0._64_4_;
                auVar33._8_4_ = local_29e0._72_4_;
                auVar33._12_4_ = local_29e0._76_4_;
                auVar33._16_4_ = local_29e0._80_4_;
                auVar33._20_4_ = local_29e0._84_4_;
                auVar33._24_4_ = local_29e0._88_4_;
                auVar33._28_4_ = local_29e0._92_4_;
                auVar55 = vmulps_avx512vl(auVar83,local_2940);
                auVar62 = vmulps_avx512vl(auVar80,local_2940);
                auVar63 = vmulps_avx512vl(auVar79,local_2940);
                auVar55 = vfmadd231ps_avx512vl(auVar55,local_2960,auVar108);
                auVar62 = vfmadd231ps_avx512vl(auVar62,local_2960,auVar105);
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar103,local_2960);
                auVar55 = vfmadd231ps_avx512vl(auVar55,local_2980,auVar97);
                auVar62 = vfmadd231ps_avx512vl(auVar62,local_2980,auVar95);
                auVar63 = vfmadd231ps_avx512vl(auVar63,auVar87,local_2980);
                auVar67 = auVar109._0_32_;
                vandps_avx512vl(auVar55,auVar67);
                auVar68 = auVar110._0_32_;
                uVar47 = vcmpps_avx512vl(auVar63,auVar68,1);
                bVar37 = (bool)((byte)uVar47 & 1);
                iVar50 = auVar110._0_4_;
                auVar64._0_4_ = (uint)bVar37 * iVar50 | (uint)!bVar37 * auVar55._0_4_;
                bVar37 = (bool)((byte)(uVar47 >> 1) & 1);
                iVar72 = auVar110._4_4_;
                auVar64._4_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * auVar55._4_4_;
                bVar37 = (bool)((byte)(uVar47 >> 2) & 1);
                iVar73 = auVar110._8_4_;
                auVar64._8_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * auVar55._8_4_;
                bVar37 = (bool)((byte)(uVar47 >> 3) & 1);
                iVar74 = auVar110._12_4_;
                auVar64._12_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * auVar55._12_4_;
                bVar37 = (bool)((byte)(uVar47 >> 4) & 1);
                iVar75 = auVar110._16_4_;
                auVar64._16_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * auVar55._16_4_;
                bVar37 = (bool)((byte)(uVar47 >> 5) & 1);
                iVar76 = auVar110._20_4_;
                auVar64._20_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * auVar55._20_4_;
                bVar37 = (bool)((byte)(uVar47 >> 6) & 1);
                iVar77 = auVar110._24_4_;
                iVar78 = auVar110._28_4_;
                auVar64._24_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * auVar55._24_4_;
                bVar37 = SUB81(uVar47 >> 7,0);
                auVar64._28_4_ = (uint)bVar37 * iVar78 | (uint)!bVar37 * auVar55._28_4_;
                vandps_avx512vl(auVar62,auVar67);
                uVar47 = vcmpps_avx512vl(auVar64,auVar68,1);
                bVar37 = (bool)((byte)uVar47 & 1);
                auVar65._0_4_ = (uint)bVar37 * iVar50 | (uint)!bVar37 * auVar62._0_4_;
                bVar37 = (bool)((byte)(uVar47 >> 1) & 1);
                auVar65._4_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * auVar62._4_4_;
                bVar37 = (bool)((byte)(uVar47 >> 2) & 1);
                auVar65._8_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * auVar62._8_4_;
                bVar37 = (bool)((byte)(uVar47 >> 3) & 1);
                auVar65._12_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * auVar62._12_4_;
                bVar37 = (bool)((byte)(uVar47 >> 4) & 1);
                auVar65._16_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * auVar62._16_4_;
                bVar37 = (bool)((byte)(uVar47 >> 5) & 1);
                auVar65._20_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * auVar62._20_4_;
                bVar37 = (bool)((byte)(uVar47 >> 6) & 1);
                auVar65._24_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * auVar62._24_4_;
                bVar37 = SUB81(uVar47 >> 7,0);
                auVar65._28_4_ = (uint)bVar37 * iVar78 | (uint)!bVar37 * auVar62._28_4_;
                vandps_avx512vl(auVar63,auVar67);
                uVar47 = vcmpps_avx512vl(auVar65,auVar68,1);
                bVar37 = (bool)((byte)uVar47 & 1);
                auVar66._0_4_ = (uint)bVar37 * iVar50 | (uint)!bVar37 * auVar63._0_4_;
                bVar37 = (bool)((byte)(uVar47 >> 1) & 1);
                auVar66._4_4_ = (uint)bVar37 * iVar72 | (uint)!bVar37 * auVar63._4_4_;
                bVar37 = (bool)((byte)(uVar47 >> 2) & 1);
                auVar66._8_4_ = (uint)bVar37 * iVar73 | (uint)!bVar37 * auVar63._8_4_;
                bVar37 = (bool)((byte)(uVar47 >> 3) & 1);
                auVar66._12_4_ = (uint)bVar37 * iVar74 | (uint)!bVar37 * auVar63._12_4_;
                bVar37 = (bool)((byte)(uVar47 >> 4) & 1);
                auVar66._16_4_ = (uint)bVar37 * iVar75 | (uint)!bVar37 * auVar63._16_4_;
                bVar37 = (bool)((byte)(uVar47 >> 5) & 1);
                auVar66._20_4_ = (uint)bVar37 * iVar76 | (uint)!bVar37 * auVar63._20_4_;
                bVar37 = (bool)((byte)(uVar47 >> 6) & 1);
                auVar66._24_4_ = (uint)bVar37 * iVar77 | (uint)!bVar37 * auVar63._24_4_;
                bVar37 = SUB81(uVar47 >> 7,0);
                auVar66._28_4_ = (uint)bVar37 * iVar78 | (uint)!bVar37 * auVar63._28_4_;
                auVar55 = vrcp14ps_avx512vl(auVar64);
                auVar62 = vfnmadd213ps_avx512vl(auVar64,auVar55,auVar69);
                auVar62 = vfmadd132ps_avx512vl(auVar62,auVar55,auVar55);
                auVar55 = vrcp14ps_avx512vl(auVar65);
                auVar63 = vfnmadd213ps_avx512vl(auVar65,auVar55,auVar69);
                auVar63 = vfmadd132ps_avx512vl(auVar63,auVar55,auVar55);
                auVar55 = vrcp14ps_avx512vl(auVar66);
                auVar67 = vfnmadd213ps_avx512vl(auVar66,auVar55,auVar69);
                uVar38 = *(undefined4 *)(uVar40 + 0xc0 + lVar42);
                auVar27._4_4_ = uVar38;
                auVar27._0_4_ = uVar38;
                auVar27._8_4_ = uVar38;
                auVar27._12_4_ = uVar38;
                auVar27._16_4_ = uVar38;
                auVar27._20_4_ = uVar38;
                auVar27._24_4_ = uVar38;
                auVar27._28_4_ = uVar38;
                auVar68 = vfmadd213ps_avx512vl(auVar83,auVar33,auVar27);
                uVar38 = *(undefined4 *)(uVar40 + 0xd0 + lVar42);
                auVar28._4_4_ = uVar38;
                auVar28._0_4_ = uVar38;
                auVar28._8_4_ = uVar38;
                auVar28._12_4_ = uVar38;
                auVar28._16_4_ = uVar38;
                auVar28._20_4_ = uVar38;
                auVar28._24_4_ = uVar38;
                auVar28._28_4_ = uVar38;
                auVar69 = vfmadd213ps_avx512vl(auVar80,auVar33,auVar28);
                auVar67 = vfmadd132ps_avx512vl(auVar67,auVar55,auVar55);
                uVar38 = *(undefined4 *)(uVar40 + 0xe0 + lVar42);
                auVar29._4_4_ = uVar38;
                auVar29._0_4_ = uVar38;
                auVar29._8_4_ = uVar38;
                auVar29._12_4_ = uVar38;
                auVar29._16_4_ = uVar38;
                auVar29._20_4_ = uVar38;
                auVar29._24_4_ = uVar38;
                auVar29._28_4_ = uVar38;
                auVar55 = vfmadd213ps_avx512vl(auVar79,auVar33,auVar29);
                auVar68 = vfmadd231ps_avx512vl(auVar68,auVar32,auVar108);
                auVar69 = vfmadd231ps_avx512vl(auVar69,auVar32,auVar105);
                auVar55 = vfmadd231ps_avx512vl(auVar55,auVar32,auVar103);
                auVar68 = vfmadd231ps_avx512vl(auVar68,auVar31,auVar97);
                auVar69 = vfmadd231ps_avx512vl(auVar69,auVar31,auVar95);
                auVar70 = vfmadd231ps_avx512vl(auVar55,auVar31,auVar87);
                auVar55 = vsubps_avx(auVar57,auVar68);
                auVar57 = vmulps_avx512vl(auVar62,auVar55);
                auVar55 = vsubps_avx(auVar54,auVar69);
                auVar54 = vmulps_avx512vl(auVar63,auVar55);
                auVar55 = vsubps_avx(auVar59,auVar70);
                auVar59 = vmulps_avx512vl(auVar67,auVar55);
                auVar55 = vsubps_avx512vl(auVar60,auVar68);
                auVar60 = vmulps_avx512vl(auVar62,auVar55);
                auVar55 = vsubps_avx(auVar61,auVar69);
                auVar61 = vmulps_avx512vl(auVar63,auVar55);
                auVar55 = vsubps_avx(auVar56,auVar70);
                auVar62 = vmulps_avx512vl(auVar67,auVar55);
                auVar55 = vpminsd_avx2(auVar57,auVar60);
                auVar56 = vpminsd_avx2(auVar54,auVar61);
                auVar55 = vpmaxsd_avx2(auVar55,auVar56);
                auVar56 = vpminsd_avx2(auVar59,auVar62);
                auVar56 = vpmaxsd_avx2(auVar55,auVar56);
                auVar55 = vpmaxsd_avx2(auVar57,auVar60);
                auVar57 = vpmaxsd_avx2(auVar54,auVar61);
                auVar57 = vpminsd_avx2(auVar55,auVar57);
                auVar55 = vpmaxsd_avx2(auVar59,auVar62);
                auVar55 = vpminsd_avx2(auVar57,auVar55);
                auVar34._4_4_ = uStack_27fc;
                auVar34._0_4_ = local_2800;
                auVar34._8_4_ = uStack_27f8;
                auVar34._12_4_ = uStack_27f4;
                auVar34._16_4_ = uStack_27f0;
                auVar34._20_4_ = uStack_27ec;
                auVar34._24_4_ = uStack_27e8;
                auVar34._28_4_ = uStack_27e4;
                auVar57 = vpmaxsd_avx2(auVar56,auVar34);
                auVar55 = vpminsd_avx2(auVar55,local_27e0);
                uVar47 = vcmpps_avx512vl(auVar57,auVar55,2);
              }
              uVar17 = vcmpps_avx512vl(local_27e0,auVar114._0_32_,6);
              uVar47 = uVar47 & uVar17;
              uVar17 = uVar46;
              auVar71 = auVar58;
              if ((byte)uVar47 != 0) {
                auVar56 = vblendmps_avx512vl(auVar113._0_32_,auVar56);
                bVar37 = (bool)((byte)uVar47 & 1);
                auVar71._0_4_ = (uint)bVar37 * auVar56._0_4_ | (uint)!bVar37 * auVar55._0_4_;
                bVar37 = (bool)((byte)(uVar47 >> 1) & 1);
                auVar71._4_4_ = (uint)bVar37 * auVar56._4_4_ | (uint)!bVar37 * auVar55._4_4_;
                bVar37 = (bool)((byte)(uVar47 >> 2) & 1);
                auVar71._8_4_ = (uint)bVar37 * auVar56._8_4_ | (uint)!bVar37 * auVar55._8_4_;
                bVar37 = (bool)((byte)(uVar47 >> 3) & 1);
                auVar71._12_4_ = (uint)bVar37 * auVar56._12_4_ | (uint)!bVar37 * auVar55._12_4_;
                bVar37 = (bool)((byte)(uVar47 >> 4) & 1);
                auVar71._16_4_ = (uint)bVar37 * auVar56._16_4_ | (uint)!bVar37 * auVar55._16_4_;
                bVar37 = (bool)((byte)(uVar47 >> 5) & 1);
                auVar71._20_4_ = (uint)bVar37 * auVar56._20_4_ | (uint)!bVar37 * auVar55._20_4_;
                bVar37 = (bool)((byte)(uVar47 >> 6) & 1);
                auVar71._24_4_ = (uint)bVar37 * auVar56._24_4_ | (uint)!bVar37 * auVar55._24_4_;
                bVar37 = SUB81(uVar47 >> 7,0);
                auVar71._28_4_ = (uint)bVar37 * auVar56._28_4_ | (uint)!bVar37 * auVar55._28_4_;
                uVar17 = uVar48;
                if (uVar46 != 8) {
                  *puVar41 = uVar46;
                  puVar41 = puVar41 + 1;
                  *pauVar44 = auVar58;
                  pauVar44 = pauVar44 + 1;
                }
              }
              auVar58 = auVar71;
              uVar46 = uVar17;
              lVar42 = lVar42 + 4;
            } while (lVar42 != 0);
            if (uVar46 == 8) goto LAB_0070dbbf;
            uVar16 = vcmpps_avx512vl(auVar58,local_27e0,9);
            auVar114 = ZEXT3264(auVar58);
            root.ptr = uVar46;
          } while ((byte)uVar43 < (byte)POPCOUNT((int)uVar16));
          *puVar41 = uVar46;
          puVar41 = puVar41 + 1;
          *pauVar44 = auVar58;
          pauVar44 = pauVar44 + 1;
        }
        else {
          do {
            sVar2 = 0;
            for (uVar40 = uVar46; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              sVar2 = sVar2 + 1;
            }
            bVar37 = occluded1(This,bvh,root,sVar2,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_false> *)&local_29e0.field_0,context);
            bVar36 = (byte)(1 << ((uint)sVar2 & 0x1f));
            if (!bVar37) {
              bVar36 = 0;
            }
            local_2a44 = local_2a44 | bVar36;
            uVar46 = uVar46 - 1 & uVar46;
          } while (uVar46 != 0);
          iVar49 = 3;
          if (local_2a44 != 0xff) {
            auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar37 = (bool)(local_2a44 >> 1 & 1);
            bVar4 = (bool)(local_2a44 >> 2 & 1);
            bVar5 = (bool)(local_2a44 >> 3 & 1);
            bVar6 = (bool)(local_2a44 >> 4 & 1);
            bVar7 = (bool)(local_2a44 >> 5 & 1);
            bVar8 = (bool)(local_2a44 >> 6 & 1);
            local_27e0._4_4_ = (uint)bVar37 * auVar55._4_4_ | (uint)!bVar37 * local_27e0._4_4_;
            local_27e0._0_4_ =
                 (uint)(local_2a44 & 1) * auVar55._0_4_ |
                 (uint)!(bool)(local_2a44 & 1) * local_27e0._0_4_;
            local_27e0._8_4_ = (uint)bVar4 * auVar55._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
            local_27e0._12_4_ = (uint)bVar5 * auVar55._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
            local_27e0._16_4_ = (uint)bVar6 * auVar55._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
            local_27e0._20_4_ = (uint)bVar7 * auVar55._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
            local_27e0._24_4_ = (uint)bVar8 * auVar55._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
            local_27e0._28_4_ =
                 (uint)(local_2a44 >> 7) * auVar55._28_4_ |
                 (uint)!(bool)(local_2a44 >> 7) * local_27e0._28_4_;
            iVar49 = 2;
          }
          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar109 = ZEXT3264(auVar55);
          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar110 = ZEXT3264(auVar55);
          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar111 = ZEXT3264(auVar55);
          auVar53 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
          auVar112 = ZEXT1664(auVar53);
          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar113 = ZEXT3264(auVar55);
          auVar114 = ZEXT3264(auVar58);
          if (uVar43 < (uint)POPCOUNT(uVar38)) goto LAB_0070d771;
        }
LAB_0070dbbf:
      } while (iVar49 != 3);
LAB_0070de06:
      local_2a44 = local_2a44 & bVar45;
      bVar37 = (bool)(local_2a44 >> 1 & 1);
      bVar4 = (bool)(local_2a44 >> 2 & 1);
      bVar5 = (bool)(local_2a44 >> 3 & 1);
      bVar6 = (bool)(local_2a44 >> 4 & 1);
      bVar7 = (bool)(local_2a44 >> 5 & 1);
      bVar8 = (bool)(local_2a44 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(local_2a44 & 1) * -0x800000 |
           (uint)!(bool)(local_2a44 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar37 * -0x800000 | (uint)!bVar37 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(local_2a44 >> 7) * -0x800000 |
           (uint)!(bool)(local_2a44 >> 7) * *(int *)(ray + 0x11c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }